

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

void __thiscall PruneReplayer::access_pipeline_layout(PruneReplayer *this,Hash hash)

{
  mapped_type pVVar1;
  size_type sVar2;
  mapped_type *ppVVar3;
  uint32_t layout;
  ulong uVar4;
  Hash local_20;
  
  if (hash != 0) {
    local_20 = hash;
    sVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->accessed_pipeline_layouts)._M_h,&local_20);
    if (sVar2 == 0) {
      std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->accessed_pipeline_layouts,&local_20);
      ppVVar3 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->pipeline_layouts,&local_20);
      pVVar1 = *ppVVar3;
      if (pVVar1 != (mapped_type)0x0) {
        for (uVar4 = 0; uVar4 < pVVar1->setLayoutCount; uVar4 = uVar4 + 1) {
          access_descriptor_set(this,(Hash)pVVar1->pSetLayouts[uVar4]);
        }
      }
    }
  }
  return;
}

Assistant:

void access_pipeline_layout(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_pipeline_layouts.count(hash))
			return;
		accessed_pipeline_layouts.insert(hash);

		auto *create_info = pipeline_layouts[hash];
		if (!create_info)
			return;

		for (uint32_t layout = 0; layout < create_info->setLayoutCount; layout++)
			access_descriptor_set((Hash)create_info->pSetLayouts[layout]);
	}